

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateJSONEncodingAPIs
          (SwiftGenerator *this,StructDef *struct_def)

{
  bool bVar1;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  SwiftGenerator *this_local;
  
  local_18 = struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"extension {{STRUCTNAME}}: Encodable {",&local_39);
  CodeWriter::operator+=(&this->code_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  Indent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  CodeWriter::operator+=(&this->code_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::empty
                    (&(local_18->fields).vec);
  if (!bVar1) {
    GenerateCodingKeys(this,local_18);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"{{ACCESS_TYPE}} func encode(to encoder: Encoder) throws {",
             &local_99);
  CodeWriter::operator+=(&this->code_,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  Indent(this);
  bVar1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::empty
                    (&(local_18->fields).vec);
  if (!bVar1) {
    GenerateEncoderBody(this,local_18);
  }
  Outdent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"}",&local_c1);
  CodeWriter::operator+=(&this->code_,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  Outdent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"}",&local_e9);
  CodeWriter::operator+=(&this->code_,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
  CodeWriter::operator+=(&this->code_,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  return;
}

Assistant:

void GenerateJSONEncodingAPIs(const StructDef &struct_def) {
    code_ += "extension {{STRUCTNAME}}: Encodable {";
    Indent();
    code_ += "";
    if (struct_def.fields.vec.empty() == false) GenerateCodingKeys(struct_def);

    code_ += "{{ACCESS_TYPE}} func encode(to encoder: Encoder) throws {";
    Indent();
    if (struct_def.fields.vec.empty() == false) GenerateEncoderBody(struct_def);
    Outdent();
    code_ += "}";
    Outdent();
    code_ += "}";
    code_ += "";
  }